

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O2

ON_Hatch *
ON_Hatch::HatchFromBrep
          (ON_Hatch *use_this_hatch,ON_Brep *brep,int face_index,int pattern_index,
          double pattern_rotation_radians,double pattern_scale,ON_3dPoint basepoint)

{
  TYPE TVar1;
  double dVar2;
  ON_3dPoint p;
  bool bVar3;
  int iVar4;
  int iVar5;
  ON_BrepFace *this;
  ON_BrepLoop *this_00;
  ON_BrepTrim *this_01;
  ON_Curve *this_02;
  ON_HatchLoop *this_03;
  ON_PolyCurve *this_04;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int lti;
  ON_Plane *pOVar9;
  ON_Plane *pOVar10;
  int ei;
  ulong uVar11;
  byte bVar12;
  ON_SimpleArray<ON_Curve_*> edgecurves;
  ON_Plane plane;
  ON_Curve *ec;
  
  bVar12 = 0;
  if (use_this_hatch != (ON_Hatch *)0x0) {
    Internal_Destroy(use_this_hatch);
  }
  if (brep == (ON_Brep *)0x0) {
    return (ON_Hatch *)0x0;
  }
  if ((face_index < 0) ||
     ((brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count <=
      face_index)) {
    face_index = 0;
  }
  this = ON_Brep::Face(brep,face_index);
  if (this == (ON_BrepFace *)0x0) {
    return (ON_Hatch *)0x0;
  }
  ON_Plane::ON_Plane(&plane);
  iVar4 = (*(this->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object.
            _vptr_ON_Object[0x2f])(0x3df0000000000000,this);
  if ((char)iVar4 != '\0') {
    if (use_this_hatch == (ON_Hatch *)0x0) {
      use_this_hatch = (ON_Hatch *)operator_new(0xd0);
      memset(use_this_hatch,0,0xd0);
      ON_Hatch(use_this_hatch);
    }
    else {
      Internal_Destroy(use_this_hatch);
    }
    iVar4 = 0;
    if (0 < pattern_index) {
      iVar4 = pattern_index;
    }
    bVar3 = ON_3dPoint::operator==(&ON_3dPoint::UnsetPoint,&basepoint);
    dVar2 = (double)(~-(ulong)(pattern_scale < 1.490116119385e-08) & (ulong)pattern_scale |
                    -(ulong)(pattern_scale < 1.490116119385e-08) & 0x3ff0000000000000);
    if (bVar3) {
      basepoint.z = ON_3dPoint::Origin.z;
      basepoint.x = ON_3dPoint::Origin.x;
      basepoint.y = ON_3dPoint::Origin.y;
    }
    pOVar9 = &plane;
    pOVar10 = &use_this_hatch->m_plane;
    for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pOVar10->origin).x = (pOVar9->origin).x;
      pOVar9 = (ON_Plane *)((long)pOVar9 + (ulong)bVar12 * -0x10 + 8);
      pOVar10 = (ON_Plane *)((long)pOVar10 + (ulong)bVar12 * -0x10 + 8);
    }
    use_this_hatch->m_pattern_index = iVar4;
    use_this_hatch->m_pattern_rotation = pattern_rotation_radians;
    if (0.001 < dVar2) {
      use_this_hatch->m_pattern_scale = dVar2;
    }
    p.y = basepoint.y;
    p.x = basepoint.x;
    p.z = basepoint.z;
    ON_Plane::ClosestPointTo
              (&use_this_hatch->m_plane,p,&(use_this_hatch->m_basepoint).x,
               &(use_this_hatch->m_basepoint).y);
    iVar4 = ON_BrepFace::LoopCount(this);
    bVar3 = false;
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    for (lti = 0; lti != iVar4; lti = lti + 1) {
      edgecurves._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081dee8;
      edgecurves.m_a = (ON_Curve **)0x0;
      edgecurves.m_count = 0;
      edgecurves.m_capacity = 0;
      this_00 = ON_BrepFace::Loop(this,lti);
      if (this_00 != (ON_BrepLoop *)0x0) {
        iVar5 = ON_BrepLoop::TrimCount(this_00);
        iVar7 = 0;
        if (iVar5 < 1) {
          iVar5 = 0;
          iVar7 = 0;
        }
        for (; iVar5 != iVar7; iVar7 = iVar7 + 1) {
          this_01 = ON_BrepLoop::Trim(this_00,iVar7);
          if ((this_01 != (ON_BrepTrim *)0x0) &&
             (this_02 = ON_BrepTrim::EdgeCurveOf(this_01), this_02 != (ON_Curve *)0x0)) {
            ec = ON_Curve::Duplicate(this_02);
            if (this_01->m_bRev3d == true) {
              (*(ec->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])(ec);
            }
            ON_SimpleArray<ON_Curve_*>::Append(&edgecurves,&ec);
          }
        }
        iVar7 = edgecurves.m_count;
        uVar8 = edgecurves._16_8_ & 0xffffffff;
        if (uVar8 == 1) {
          this_04 = (ON_PolyCurve *)*edgecurves.m_a;
          if (this_04 != (ON_PolyCurve *)0x0) {
LAB_004b59b2:
            ON_Xform::ON_Xform((ON_Xform *)&ec);
            ON_Xform::ChangeBasis((ON_Xform *)&ec,&ON_xy_plane,&plane);
            (*(this_04->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x1c])
                      (this_04,(ON_Xform *)&ec);
            this_03 = (ON_HatchLoop *)onmalloc(0x10);
            ON_HatchLoop::ON_HatchLoop(this_03);
            ON_HatchLoop::SetCurve(this_03,&this_04->super_ON_Curve);
            TVar1 = this_00->m_type;
            this_03->m_type = (uint)(TVar1 != outer);
            AddLoop(use_this_hatch,this_03);
            bVar3 = (bool)(bVar3 | TVar1 == outer);
          }
        }
        else if (1 < edgecurves.m_count) {
          this_04 = (ON_PolyCurve *)operator_new(0x40);
          ON_PolyCurve::ON_PolyCurve(this_04,iVar7);
          for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
            if (edgecurves.m_a[uVar11] != (ON_Curve *)0x0) {
              ON_PolyCurve::AppendAndMatch(this_04,edgecurves.m_a[uVar11]);
            }
          }
          goto LAB_004b59b2;
        }
      }
      ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray(&edgecurves);
    }
    if (bVar3) goto LAB_004b5a9e;
    (*(use_this_hatch->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
  }
  use_this_hatch = (ON_Hatch *)0x0;
LAB_004b5a9e:
  ON_Plane::~ON_Plane(&plane);
  return use_this_hatch;
}

Assistant:

ON_Hatch* ON_Hatch::HatchFromBrep(
  ON_Hatch* use_this_hatch,
  const ON_Brep* brep,
  int face_index,
  int pattern_index,
  double pattern_rotation_radians,
  double pattern_scale,
  ON_3dPoint basepoint)
{
  ON_Hatch* newhatch = nullptr;
  if (nullptr != use_this_hatch)
    use_this_hatch->Internal_Destroy();

  if (nullptr == brep)
    return nullptr;

  if (face_index < 0 || face_index >= brep->m_F.Count())
    face_index = 0;

  const ON_BrepFace* face = brep->Face(face_index);
  if (nullptr == face)
    return nullptr;

  ON_Plane plane;
  if (!face->IsPlanar(&plane))
    return nullptr;

  if (nullptr == use_this_hatch)
    newhatch = new ON_Hatch();
  else
  {
    newhatch = use_this_hatch;
    newhatch->Internal_Destroy();
  }

  if (0 > pattern_index)
    pattern_index = 0;

  if (pattern_scale < ON_SQRT_EPSILON)
    pattern_scale = 1.0;

  if (ON_3dPoint::UnsetPoint == basepoint)
    basepoint = ON_3dPoint::Origin;

  newhatch->SetPlane(plane);
  newhatch->SetPatternIndex(pattern_index);
  newhatch->SetPatternRotation(pattern_rotation_radians);
  newhatch->SetPatternScale(pattern_scale);
  newhatch->SetBasePoint(basepoint);

  bool rc = false;
  int loopcount = face->LoopCount();
  for (int li = 0; li < loopcount; li++)
  {
    ON_Curve* loopcurve = nullptr;
    ON_SimpleArray< ON_Curve* > edgecurves;
    ON_BrepLoop* loop = face->Loop(li);
    if (nullptr != loop)
    {
      int trimcount = loop->TrimCount();
      for (int ti = 0; ti < trimcount; ti++)
      {
        ON_BrepTrim* trim = loop->Trim(ti);
        if (nullptr != trim)
        {
          const ON_Curve* edgecurve = trim->EdgeCurveOf();
          if (nullptr != edgecurve)
          {
            ON_Curve* ec = edgecurve->Duplicate();
            if (trim->m_bRev3d)
              ec->Reverse();
            edgecurves.Append(ec);
          }
        }
      }

      int edgecount = edgecurves.Count();
      if (edgecount == 1)
      {
        loopcurve = edgecurves[0];
      }
      else if (edgecount > 1)
      {
        ON_PolyCurve* pc = new ON_PolyCurve(edgecount);
        if (nullptr != pc)
        {
          for (int ei = 0; ei < edgecount; ei++)
          {
            ON_Curve* ec = edgecurves[ei];
            if (nullptr != ec)
              pc->AppendAndMatch(ec);
          }
          loopcurve = pc;
        }
      }
      if (nullptr != loopcurve)
      {
        ON_Xform xf;
        xf.ChangeBasis(ON_xy_plane, plane);
        loopcurve->Transform(xf);
        ON_HatchLoop* hloop = new ON_HatchLoop();
        hloop->SetCurve(*loopcurve);
        if(loop->m_type == ON_BrepLoop::TYPE::outer)
        {
          hloop->SetType(ON_HatchLoop::eLoopType::ltOuter);
          rc = true;
        }
        else
          hloop->SetType(ON_HatchLoop::eLoopType::ltInner);
        newhatch->AddLoop(hloop);
      }
    }
  }
  if (!rc)
  {
    if (nullptr != newhatch)
    {
      delete newhatch;
      newhatch = nullptr;
    }
  }

  return newhatch;
}